

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O1

int16_t spell_chance(wchar_t spell_index)

{
  short sVar1;
  loc grid;
  wchar_t *pwVar2;
  _Bool _Var3;
  int16_t iVar4;
  int iVar5;
  class_spell *pcVar6;
  int iVar7;
  wchar_t *pwVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  int iVar11;
  ulong uVar12;
  
  wVar10 = (player->class->magic).total_spells;
  iVar4 = 100;
  if (wVar10 != L'\0') {
    pcVar6 = (class_spell *)0x0;
    if ((L'\xffffffff' < spell_index) && (spell_index < wVar10)) {
      pwVar2 = &((player->class->magic).books)->num_spells;
      wVar10 = L'\0';
      do {
        wVar9 = wVar10;
        pwVar8 = pwVar2;
        wVar10 = *pwVar8 + wVar9;
        pwVar2 = pwVar8 + 8;
      } while (wVar10 <= spell_index);
      pcVar6 = *(class_spell **)(pwVar8 + 3) + (spell_index - wVar9);
    }
    if (pcVar6 != (class_spell *)0x0) {
      uVar12 = (ulong)(player->state).stat_ind[pcVar6->realm->stat];
      iVar5 = pcVar6->smana - (int)player->csp;
      iVar11 = iVar5 * 5;
      if (iVar5 == 0 || pcVar6->smana < (int)player->csp) {
        iVar11 = 0;
      }
      iVar11 = iVar11 + ((pcVar6->sfail + ((int)player->lev - pcVar6->slevel) * -3) -
                        adj_mag_stat[uVar12]);
      iVar5 = adj_mag_fail[uVar12];
      _Var3 = flag_has_dbg((player->state).pflags,10,0x2d,"player->state.pflags","(PF_STRONG_MAGIC)"
                          );
      iVar7 = 5;
      if (_Var3) {
        iVar7 = iVar5;
      }
      if (uVar12 < 0x14) {
        iVar7 = iVar5;
      }
      _Var3 = flag_has_dbg((player->state).pflags,10,0x1f,"player->state.pflags","(PF_UNLIGHT)");
      iVar5 = iVar11;
      if (_Var3) {
        grid.x = (player->grid).x;
        grid.y = (player->grid).y;
        _Var3 = square_islit(cave,grid);
        iVar5 = iVar11 + 0x19;
        if (!_Var3) {
          iVar5 = iVar11;
        }
      }
      _Var3 = player_of_has(player,L'\x1c');
      iVar11 = iVar5 + 0x14;
      if (!_Var3) {
        iVar11 = iVar5;
      }
      if (iVar11 <= iVar7) {
        iVar11 = iVar7;
      }
      iVar5 = 0x32;
      if (iVar11 < 0x32) {
        iVar5 = iVar11;
      }
      sVar1 = player->timed[9];
      iVar11 = iVar5 + 0xf;
      if (sVar1 == 0) {
        iVar11 = iVar5;
      }
      if (0x32 < sVar1) {
        iVar11 = iVar5 + 0x19;
      }
      if (player->timed[0x19] != 0) {
        iVar11 = iVar11 / 2 + 0x32;
      }
      iVar4 = 0x5f;
      if (iVar11 < 0x5f) {
        iVar4 = (int16_t)iVar11;
      }
    }
  }
  return iVar4;
}

Assistant:

int16_t spell_chance(int spell_index)
{
	int chance = 100, minfail;

	const struct class_spell *spell;

	/* Paranoia -- must be literate */
	if (!player->class->magic.total_spells) return chance;

	/* Get the spell */
	spell = spell_by_index(player, spell_index);
	if (!spell) return chance;

	/* Extract the base spell failure rate */
	chance = spell->sfail;

	/* Reduce failure rate by "effective" level adjustment */
	chance -= 3 * (player->lev - spell->slevel);

	/* Reduce failure rate by casting stat level adjustment */
	chance -= fail_adjust(player, spell);

	/* Not enough mana to cast */
	if (spell->smana > player->csp)
		chance += 5 * (spell->smana - player->csp);

	/* Get the minimum failure rate for the casting stat level */
	minfail = min_fail(player, spell);

	/* Non-full spellcasters never get better than 5 percent */
	if (!player_has(player, PF_STRONG_MAGIC) && minfail < 5) {
		minfail = 5;
	}

	/* Necromancers are punished by being on lit squares */
	if (player_has(player, PF_UNLIGHT) && square_islit(cave, player->grid)) {
		chance += 25;
	}

	/* Fear makes spells harder (before minfail) */
	/* Note that spells that remove fear have a much lower fail rate than
	 * surrounding spells, to make sure this doesn't cause mega fail */
	if (player_of_has(player, OF_AFRAID)) chance += 20;

	/* Minimal and maximal failure rate */
	if (chance < minfail) chance = minfail;
	if (chance > 50) chance = 50;

	/* Stunning makes spells harder (after minfail) */
	if (player->timed[TMD_STUN] > 50) {
		chance += 25;
	} else if (player->timed[TMD_STUN]) {
		chance += 15;
	}

	/* Amnesia makes spells very difficult */
	if (player->timed[TMD_AMNESIA]) {
		chance = 50 + chance / 2;
	}

	/* Always a 5 percent chance of working */
	if (chance > 95) {
		chance = 95;
	}

	/* Return the chance */
	return (chance);
}